

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCodeMetadataSection
          (BinaryReader *this,string_view name,Offset section_size)

{
  ulong uVar1;
  int iVar2;
  Result RVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  Address data_size;
  Index num_metadata;
  Index function_index;
  Index num_functions;
  void *data;
  undefined8 local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  void *local_38;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd7])
                    (this->delegate_,name._M_len,name._M_str);
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&local_44,"function count");
    if (RVar3.enum_ != Error) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd8])(this->delegate_,(ulong)local_44);
      if (iVar2 == 0) {
        if (local_44 != 0) {
          uVar7 = 0;
          local_50 = local_44;
          uVar9 = 0xffffffff;
          do {
            RVar3 = ReadCount(this,&local_48,"function index");
            uVar8 = local_48;
            if (RVar3.enum_ == Error) {
LAB_0017bb6c:
              bVar10 = false;
              uVar8 = uVar9;
            }
            else {
              if (local_48 < this->num_func_imports_) {
                pcVar6 = "function import can\'t have metadata (got %u)";
LAB_0017bb62:
                PrintError(this,pcVar6,(ulong)local_48);
                goto LAB_0017bb6c;
              }
              if (this->num_func_imports_ + this->num_function_signatures_ <= local_48) {
                pcVar6 = "invalid function index: %u";
                goto LAB_0017bb62;
              }
              if (local_48 == uVar9) {
                pcVar6 = "duplicate function index: %u";
                goto LAB_0017bb62;
              }
              if (local_48 <= uVar9 && uVar9 != 0xffffffff) {
                pcVar6 = "function index out of order: %u";
                goto LAB_0017bb62;
              }
              RVar3 = ReadCount(this,&local_4c,"metadata instances count");
              uVar9 = local_4c;
              if (RVar3.enum_ == Error) {
LAB_0017bbb8:
                bVar10 = false;
              }
              else {
                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd9])
                                  (this->delegate_,(ulong)uVar8,(ulong)local_4c);
                if (iVar2 == 0) {
                  bVar10 = uVar9 == 0;
                  if (!bVar10) {
                    uVar4 = 0xffffffffffffffff;
                    do {
                      uVar1 = local_40;
                      RVar3 = ReadU32Leb128(this,(uint32_t *)&local_58,"code offset");
                      uVar5 = (ulong)(uint)local_58;
                      local_40 = uVar1;
                      if (RVar3.enum_ == Error) {
LAB_0017bcb4:
                        bVar10 = false;
                      }
                      else {
                        local_40 = uVar5;
                        if (uVar5 == uVar4) {
                          pcVar6 = "duplicate code offset: %zx";
LAB_0017bcad:
                          PrintError(this,pcVar6,uVar5);
                          goto LAB_0017bcb4;
                        }
                        if (uVar5 <= uVar4 && uVar4 != 0xffffffffffffffff) {
                          pcVar6 = "code offset out of order: %zx";
                          goto LAB_0017bcad;
                        }
                        RVar3 = ReadBytes(this,&local_38,&local_58,"instance data");
                        if (RVar3.enum_ == Error) {
                          bVar10 = false;
                          uVar4 = local_40;
                        }
                        else {
                          iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xda])
                                            (this->delegate_,uVar5,local_38,
                                             CONCAT44(local_58._4_4_,(uint)local_58));
                          if (iVar2 == 0) {
                            bVar10 = true;
                            uVar4 = local_40;
                          }
                          else {
                            bVar10 = false;
                            PrintError(this,"OnCodeMetadata callback failed");
                            uVar4 = local_40;
                          }
                        }
                      }
                      if (!bVar10) goto LAB_0017bbb8;
                      uVar9 = uVar9 - 1;
                    } while (uVar9 != 0);
                    bVar10 = true;
                  }
                }
                else {
                  bVar10 = false;
                  PrintError(this,"OnCodeMetadataCount callback failed");
                }
              }
            }
            if (!bVar10) {
              return (Result)Error;
            }
            uVar7 = uVar7 + 1;
            uVar9 = uVar8;
          } while (uVar7 != local_50);
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xdb])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        pcVar6 = "EndCodeMetadataSection callback failed";
      }
      else {
        pcVar6 = "OnCodeMetadataFuncCount callback failed";
      }
      PrintError(this,pcVar6);
    }
  }
  else {
    PrintError(this,"BeginCodeMetadataSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadCodeMetadataSection(std::string_view name,
                                             Offset section_size) {
  CALLBACK(BeginCodeMetadataSection, name, section_size);

  Index num_functions;
  CHECK_RESULT(ReadCount(&num_functions, "function count"));
  CALLBACK(OnCodeMetadataFuncCount, num_functions);

  Index last_function_index = kInvalidIndex;
  for (Index i = 0; i < num_functions; ++i) {
    Index function_index;
    CHECK_RESULT(ReadCount(&function_index, "function index"));
    ERROR_UNLESS(function_index >= num_func_imports_,
                 "function import can't have metadata (got %" PRIindex ")",
                 function_index);
    ERROR_UNLESS(function_index < NumTotalFuncs(),
                 "invalid function index: %" PRIindex, function_index);
    ERROR_UNLESS(function_index != last_function_index,
                 "duplicate function index: %" PRIindex, function_index);
    ERROR_UNLESS(last_function_index == kInvalidIndex ||
                     function_index > last_function_index,
                 "function index out of order: %" PRIindex, function_index);
    last_function_index = function_index;

    Index num_metadata;
    CHECK_RESULT(ReadCount(&num_metadata, "metadata instances count"));

    CALLBACK(OnCodeMetadataCount, function_index, num_metadata);

    Offset last_code_offset = kInvalidOffset;
    for (Index j = 0; j < num_metadata; ++j) {
      Offset code_offset;
      CHECK_RESULT(ReadOffset(&code_offset, "code offset"));
      ERROR_UNLESS(code_offset != last_code_offset,
                   "duplicate code offset: %" PRIzx, code_offset);
      ERROR_UNLESS(
          last_code_offset == kInvalidOffset || code_offset > last_code_offset,
          "code offset out of order: %" PRIzx, code_offset);
      last_code_offset = code_offset;

      Address data_size;
      const void* data;
      CHECK_RESULT(ReadBytes(&data, &data_size, "instance data"));
      CALLBACK(OnCodeMetadata, code_offset, data, data_size);
    }
  }

  CALLBACK(EndCodeMetadataSection);
  return Result::Ok;
}